

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe24At6(uint8_t *buf)

{
  return (ulong)((uint)(*buf >> 6) +
                ((uint)buf[1] | (uint)buf[2] << 8 | (buf[3] & 0x3f) << 0x10) * 4);
}

Assistant:

std::uint64_t readFlUIntLe24At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0xffffff);
    return res;
}